

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_image_function.cpp
# Opt level: O2

void example3(Image *imageIn1,Image *imageIn2,Image *imageOut)

{
  Image croppedOut;
  
  Image_Function::BitwiseOr(&croppedOut,imageIn1,10,10,imageIn2,0x28a,0x300,0x80,0x80);
  Image_Function::Copy(&croppedOut,0,0,imageOut,0,0,0x80,0x80);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&croppedOut);
  return;
}

Assistant:

void example3( const PenguinV_Image::Image & imageIn1, const PenguinV_Image::Image & imageIn2, PenguinV_Image::Image & imageOut )
{
    // Do Bitwise OR and store result in cropped output image (move operator)
    PenguinV_Image::Image croppedOut = Image_Function::BitwiseOr( imageIn1, // first input image
                                                                10,       // X coordinate of first input image area
                                                                10,       // Y coordinate of first input image area
                                                                imageIn2, // second input image
                                                                650,      // X coordinate of second input image area
                                                                768,      // Y coordinate of second input image area
                                                                128,      // width of the area
                                                                128       // height of the area
    );

    // Copy the result into output image
    Image_Function::Copy( croppedOut, // cropped output image
                          0,          // X coordinate where we get information from cropped output image
                          0,          // Y coordinate where we get information from cropped output image
                          imageOut,   // output image
                          0,          // X coordinate where we put information to output image
                          0,          // Y coordinate where we put information to output image
                          128,        // width of copying area
                          128         // height of copying area
    );
}